

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  bool *out_limits;
  Limits *out_limits_00;
  uint uVar1;
  ModuleField *pMVar2;
  pointer ppMVar3;
  pointer ppMVar4;
  Expr *pEVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ModuleFieldMixin<(wabt::ModuleFieldType)7> *pMVar8;
  _func_int ***ppp_Var9;
  undefined8 uVar10;
  bool bVar11;
  Result RVar12;
  Result RVar13;
  MemoryModuleField *import;
  ulong uVar14;
  pointer *__ptr;
  char *pcVar15;
  uint32_t *puVar16;
  string name;
  Location loc;
  undefined1 local_138 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_128;
  DataSegmentModuleField *local_110;
  uint32_t *local_108;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_100;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_f8;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_f0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Location local_b8;
  Var local_98;
  ModuleFieldList local_48;
  
  RVar12 = Expect(this,Lpar);
  if (RVar12.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_98,this);
  uStack_d0 = (char *)CONCAT44(local_98.loc.filename._M_str._4_4_,local_98.loc.filename._M_str._0_4_
                              );
  local_c8 = CONCAT44(local_98.loc.field_1.field_0.first_column,local_98.loc.field_1.field_0.line);
  uStack_c0 = CONCAT44(local_98.loc.field_1._12_4_,local_98.loc.field_1.field_0.last_column);
  local_d8 = (anon_union_16_2_ecfd7102_for_Location_1 *)local_98.loc.filename._M_len;
  RVar12 = Expect(this,Memory);
  if (RVar12.enum_ == Error) {
    return (Result)Error;
  }
  local_138._8_8_ = local_128.field2 + 8;
  local_128.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
  local_128.field2[8] = 0;
  ParseBindVarOpt(this,(string *)(local_138 + 8));
  local_48.size_ = 0;
  local_48.first_ = (ModuleField *)0x0;
  local_48.last_ = (ModuleField *)0x0;
  RVar12 = ParseInlineExports(this,&local_48,Memory);
  RVar13.enum_ = Error;
  if (RVar12.enum_ == Error) goto LAB_00193d95;
  bVar11 = PeekMatchLpar(this,Import);
  if (bVar11) {
    CheckImportOrdering(this,module);
    import = (MemoryModuleField *)operator_new(0x90);
    (((string *)
     &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p =
         (pointer)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc;
    ((string *)
    &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
     super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc)->
    _M_local_buf[0] = '\0';
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc)->
          _M_local_buf + 0x10) =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.type_;
    pMVar8 = &import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>;
    *(char *)((long)&(pMVar8->super_ModuleField).loc.field_1 + 8) = '\0';
    *(char *)((long)&(pMVar8->super_ModuleField).loc.field_1 + 9) = '\0';
    *(char *)((long)&(pMVar8->super_ModuleField).loc.field_1 + 10) = '\0';
    *(char *)((long)&(pMVar8->super_ModuleField).loc.field_1 + 0xb) = '\0';
    *(char *)((long)&(pMVar8->super_ModuleField).loc.field_1 + 0xc) = '\0';
    *(char *)((long)&(pMVar8->super_ModuleField).loc.field_1 + 0xd) = '\0';
    *(char *)((long)&(pMVar8->super_ModuleField).loc.field_1 + 0xe) = '\0';
    *(char *)((long)&(pMVar8->super_ModuleField).loc.field_1 + 0xf) = '\0';
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.type_)->
    _M_local_buf[0] = '\0';
    *(undefined4 *)&(import->memory).name._M_string_length = 2;
    (import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField._vptr_ModuleField =
         (_func_int **)&PTR__MemoryImport_00243d38;
    (import->memory).name.field_2._M_allocated_capacity = (size_type)&(import->memory).page_limits;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&(import->memory).name.field_2,local_138._8_8_,
               (char *)(local_138._8_8_ + (long)local_128.field_1.offset));
    (import->memory).page_limits.has_max = false;
    (import->memory).page_limits.is_shared = false;
    (import->memory).page_limits.is_64 = false;
    *(undefined5 *)&(import->memory).page_limits.field_0x13 = 0;
    *(undefined8 *)&(import->memory).page_size = 0;
    *(undefined4 *)&(import->memory).field_0x3f = 0;
    *(undefined4 *)
     &import[1].super_ModuleFieldMixin<(wabt::ModuleFieldType)7>.super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField> = 0x10000;
    RVar12 = ParseInlineImport(this,(Import *)import);
    if (RVar12.enum_ != Error) {
      out_limits = &(import->memory).page_limits.has_max;
      RVar12 = ParseLimitsIndex(this,(Limits *)out_limits);
      if (((RVar12.enum_ != Error) &&
          (RVar12 = ParseLimits(this,(Limits *)out_limits), RVar12.enum_ != Error)) &&
         (RVar12 = ParsePageSize(this,(uint32_t *)
                                      &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)&import[1].
                                            super_ModuleFieldMixin<(wabt::ModuleFieldType)7>.
                                            super_ModuleField.
                                            super_intrusive_list_base<wabt::ModuleField>)->
                                       _M_allocated_capacity), RVar12.enum_ != Error)) {
        GetToken((Token *)&local_98,this);
        local_b8.filename._M_str =
             (char *)CONCAT44(local_98.loc.filename._M_str._4_4_,local_98.loc.filename._M_str._0_4_)
        ;
        local_b8.field_1.field_0.first_column = local_98.loc.field_1.field_0.first_column;
        local_b8.field_1.field_0.line = local_98.loc.field_1.field_0.line;
        local_b8.field_1._8_8_ =
             CONCAT44(local_98.loc.field_1._12_4_,local_98.loc.field_1.field_0.last_column);
        local_b8.filename._M_len = local_98.loc.filename._M_len;
        local_e0._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
             operator_new(0x48);
        *(long *)((long)local_e0._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8) =
             0;
        *(long *)((long)local_e0._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x10
                 ) = 0;
        *(size_t *)
         ((long)local_e0._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x18) =
             local_b8.filename._M_len;
        *(char **)((long)local_e0._M_t.
                         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl +
                  0x20) = local_b8.filename._M_str;
        ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
        ((long)local_e0._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x28))->
        offset = (size_t)local_b8.field_1.field_1.offset;
        *(undefined8 *)
         ((long)local_e0._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x30) =
             local_b8.field_1._8_8_;
        *(undefined4 *)
         ((long)local_e0._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x38) = 2;
        *(undefined ***)
         local_e0._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ImportModuleField_00243a48;
        *(MemoryModuleField **)
         ((long)local_e0._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x40) =
             import;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)&local_e0);
        if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
             )local_e0._M_t.
              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
            (ImportModuleField *)0x0) {
          (**(code **)(*(long *)local_e0._M_t.
                                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                _M_head_impl + 8))();
        }
        local_e0._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
             (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
              )0x0;
        goto LAB_001940ed;
      }
    }
  }
  else {
    import = (MemoryModuleField *)operator_new(0x80);
    (((string *)
     &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p = (pointer)0x0;
    ((string *)
    &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
     super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
    *(undefined4 *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc
         = (undefined4)local_d8;
    *(undefined4 *)
     ((long)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc + 4) =
         local_d8._4_4_;
    *(undefined4 *)
     ((long)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc + 8) =
         (undefined4)uStack_d0;
    *(undefined4 *)
     ((long)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc + 0xc)
         = uStack_d0._4_4_;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc)->
      _M_local_buf + 0x10) = (undefined4)local_c8;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc)->
      _M_local_buf + 0x14) = local_c8._4_4_;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc)->
      _M_local_buf + 0x18) = (undefined4)uStack_c0;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc)->
      _M_local_buf + 0x1c) = uStack_c0._4_4_;
    *(undefined4 *)
     &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.type_ = 7;
    (import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField._vptr_ModuleField =
         (_func_int **)&PTR__MemoryModuleField_00243d88;
    (import->memory).name._M_dataplus._M_p = (pointer)&(import->memory).name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&import->memory,local_138._8_8_,
               (char *)(local_138._8_8_ + (long)local_128.field_1.offset));
    out_limits_00 = &(import->memory).page_limits;
    (import->memory).page_limits.initial = 0;
    (import->memory).page_limits.max = 0;
    *(undefined4 *)((long)&(import->memory).page_limits.max + 7) = 0;
    (import->memory).page_size = 0x10000;
    RVar12 = ParseLimitsIndex(this,out_limits_00);
    RVar13.enum_ = Error;
    if (RVar12.enum_ != Error) {
      puVar16 = &(import->memory).page_size;
      bVar11 = PeekMatchLpar(this,PageSize);
      if (bVar11) {
        RVar12 = ParsePageSize(this,puVar16);
        if (RVar12.enum_ != Error) {
          bVar11 = PeekMatchLpar(this,Data);
          if (bVar11) goto LAB_00193e1c;
          Match(this,Lpar);
          local_98.loc.filename._M_len = (size_t)&local_98.loc.field_1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"inline data segment","");
          local_b8.filename._M_len = 0;
          local_b8.filename._M_str = (char *)0x0;
          local_b8.field_1.field_1.offset =
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                     &local_98,&local_98.type_);
          RVar13 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_b8,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_b8);
          if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_98.loc.filename._M_len !=
              &local_98.loc.field_1) {
            operator_delete((void *)local_98.loc.filename._M_len,
                            CONCAT44(local_98.loc.field_1.field_0.first_column,
                                     local_98.loc.field_1.field_0.line) + 1);
          }
        }
      }
      else {
LAB_00193e1c:
        bVar11 = MatchLpar(this,Data);
        if (bVar11) {
          local_108 = puVar16;
          std::make_unique<wabt::DataSegmentModuleField,wabt::Location&>((Location *)local_138);
          uVar10 = local_138._0_8_;
          ppMVar3 = (module->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppMVar4 = (module->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          GetToken((Token *)&local_98,this);
          local_b8.filename._M_str =
               (char *)CONCAT44(local_98.loc.filename._M_str._4_4_,
                                local_98.loc.filename._M_str._0_4_);
          local_b8.field_1.field_0.first_column = local_98.loc.field_1.field_0.first_column;
          local_b8.field_1.field_0.line = local_98.loc.field_1.field_0.line;
          local_b8.filename._M_len = local_98.loc.filename._M_len;
          Var::Var(&local_98,(Index)((ulong)((long)ppMVar3 - (long)ppMVar4) >> 3),&local_b8);
          Var::operator=(&((DataSegment *)(uVar10 + 0x40))->memory_var,&local_98);
          Var::~Var(&local_98);
          local_110 = (DataSegmentModuleField *)uVar10;
          local_98.loc.field_1.field_0.line = 0;
          local_98.loc.field_1.field_0.first_column = 0;
          local_98.loc.field_1.field_0.last_column = 0;
          local_98.loc.filename._M_len = 0;
          local_98.loc.filename._M_str._0_4_ = 0;
          local_98.loc.filename._M_str._4_4_ = 0;
          pcVar15 = (char *)0xfffffffe;
          if ((import->memory).page_limits.is_64 == false) {
            pcVar15 = (char *)0xffffffff;
          }
          local_e8._M_head_impl = (Expr *)operator_new(0x90);
          ((local_e8._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
          ((local_e8._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
          ((local_e8._M_head_impl)->loc).filename._M_len = 0;
          ((local_e8._M_head_impl)->loc).filename._M_str = (char *)0x0;
          *(undefined8 *)((long)&((local_e8._M_head_impl)->loc).filename._M_str + 4) = 0;
          *(undefined8 *)((long)&((local_e8._M_head_impl)->loc).field_1.field_1.offset + 4) = 0;
          (local_e8._M_head_impl)->type_ = Const;
          (local_e8._M_head_impl)->_vptr_Expr = (_func_int **)&PTR__Expr_00243648;
          local_e8._M_head_impl[1]._vptr_Expr = (_func_int **)local_98.loc.filename._M_len;
          local_e8._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ =
               (Expr *)CONCAT44(local_98.loc.filename._M_str._4_4_,
                                local_98.loc.filename._M_str._0_4_);
          local_e8._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.prev_ =
               (Expr *)CONCAT44(local_98.loc.field_1.field_0.first_column,
                                local_98.loc.field_1.field_0.line);
          local_e8._M_head_impl[1].loc.filename._M_len =
               CONCAT44(local_98.loc.field_1._12_4_,local_98.loc.field_1.field_0.last_column);
          local_e8._M_head_impl[1].loc.filename._M_str = pcVar15;
          *(undefined8 *)((long)&local_e8._M_head_impl[1].loc.field_1 + 8) = 0;
          *(undefined4 *)&local_e8._M_head_impl[2]._vptr_Expr = 0;
          intrusive_list<wabt::Expr>::push_back
                    (&((DataSegment *)(uVar10 + 0x40))->offset,
                     (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e8);
          if (local_e8._M_head_impl != (Expr *)0x0) {
            (*(local_e8._M_head_impl)->_vptr_Expr[1])();
          }
          puVar16 = local_108;
          local_e8._M_head_impl = (Expr *)0x0;
          if ((local_110->data_segment).offset.size_ == 0) {
            __assert_fail("!empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                          ,400,
                          "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                         );
          }
          pEVar5 = (local_110->data_segment).offset.last_;
          (pEVar5->loc).field_1.field_1.offset = local_c8;
          *(undefined8 *)((long)&(pEVar5->loc).field_1 + 8) = uStack_c0;
          (pEVar5->loc).filename._M_len = (size_t)local_d8;
          (pEVar5->loc).filename._M_str = uStack_d0;
          ParseTextListOpt(this,&(local_110->data_segment).data);
          RVar12 = Expect(this,Rpar);
          if (RVar12.enum_ != Error) {
            uVar1 = *puVar16;
            if ((uVar1 ^ uVar1 - 1) <= uVar1 - 1) {
              abort();
            }
            uVar14 = (long)(local_110->data_segment).data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(local_110->data_segment).data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = CONCAT44(0,uVar1);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar14;
            uVar14 = (ulong)(SUB164(auVar7 / auVar6,0) +
                            (uint)(CONCAT44(0,uVar1) * SUB168(auVar7 / auVar6,0) - uVar14 != 0));
            (import->memory).page_limits.initial = uVar14;
            (import->memory).page_limits.max = uVar14;
            (import->memory).page_limits.has_max = true;
            local_f0._M_head_impl = import;
            Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                        *)&local_f0);
            if (local_f0._M_head_impl != (MemoryModuleField *)0x0) {
              (*((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_f0._M_head_impl = (MemoryModuleField *)0x0;
            local_f8._M_head_impl = (DataSegmentModuleField *)local_138._0_8_;
            local_138._0_8_ = (DataSegmentModuleField *)0x0;
            Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                        *)&local_f8);
            if (local_f8._M_head_impl != (DataSegmentModuleField *)0x0) {
              (*((local_f8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_f8._M_head_impl = (DataSegmentModuleField *)0x0;
            import = (MemoryModuleField *)0x0;
          }
          if ((DataSegmentModuleField *)local_138._0_8_ != (DataSegmentModuleField *)0x0) {
            (*(((ModuleFieldMixin<(wabt::ModuleFieldType)8> *)local_138._0_8_)->super_ModuleField).
              _vptr_ModuleField[1])();
          }
          if (RVar12.enum_ != Error) {
            if (import != (MemoryModuleField *)0x0) {
              (*(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
                _vptr_ModuleField[1])(import);
            }
LAB_001940ed:
            anon_unknown_1::AppendInlineExportFields
                      (module,&local_48,
                       (int)((ulong)((long)(module->memories).
                                           super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(module->memories).
                                          super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
            RVar12 = Expect(this,Rpar);
            RVar13.enum_ = (Enum)(RVar12.enum_ == Error);
            goto LAB_00193d95;
          }
          RVar13.enum_ = Error;
          if (import == (MemoryModuleField *)0x0) goto LAB_00193d95;
        }
        else {
          RVar12 = ParseLimits(this,out_limits_00);
          if ((RVar12.enum_ != Error) &&
             (RVar12 = ParsePageSize(this,puVar16), RVar12.enum_ != Error)) {
            local_100._M_head_impl = import;
            Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                        *)&local_100);
            if (local_100._M_head_impl != (MemoryModuleField *)0x0) {
              (*((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_100._M_head_impl = (MemoryModuleField *)0x0;
            goto LAB_001940ed;
          }
        }
      }
    }
  }
  (*(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField._vptr_ModuleField
    [1])(import);
LAB_00193d95:
  pMVar2 = local_48.first_;
  while (pMVar2 != (ModuleField *)0x0) {
    ppp_Var9 = &pMVar2->_vptr_ModuleField;
    pMVar2 = (pMVar2->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*(*ppp_Var9)[1])();
  }
  if ((undefined1 *)local_138._8_8_ != local_128.field2 + 8) {
    operator_delete((void *)local_138._8_8_,CONCAT71(local_128._9_7_,local_128.field2[8]) + 1);
  }
  return (Result)RVar13.enum_;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<MemoryImport>(name);
    import->memory.page_size = WABT_DEFAULT_PAGE_SIZE;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    CHECK_RESULT(ParsePageSize(&import->memory.page_size));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<MemoryModuleField>(loc, name);
    field->memory.page_size = WABT_DEFAULT_PAGE_SIZE;
    CHECK_RESULT(ParseLimitsIndex(&field->memory.page_limits));
    if (PeekMatchLpar(TokenType::PageSize)) {
      // this is the data abbreviation (no limits)
      CHECK_RESULT(ParsePageSize(&field->memory.page_size));
      if (!PeekMatchLpar(TokenType::Data)) {
        ConsumeIfLpar();
        return ErrorExpected({"inline data segment"});
      }
    }
    if (MatchLpar(TokenType::Data)) {
      auto data_segment_field = std::make_unique<DataSegmentModuleField>(loc);
      DataSegment& data_segment = data_segment_field->data_segment;
      data_segment.memory_var = Var(module->memories.size(), GetLocation());
      data_segment.offset.push_back(std::make_unique<ConstExpr>(
          field->memory.page_limits.is_64 ? Const::I64(0) : Const::I32(0)));
      data_segment.offset.back().loc = loc;
      ParseTextListOpt(&data_segment.data);
      EXPECT(Rpar);

      uint32_t num_pages = WABT_BYTES_TO_MIN_PAGES(data_segment.data.size(),
                                                   field->memory.page_size);
      field->memory.page_limits.initial = num_pages;
      field->memory.page_limits.max = num_pages;
      field->memory.page_limits.has_max = true;

      module->AppendField(std::move(field));
      module->AppendField(std::move(data_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&field->memory.page_limits));
      CHECK_RESULT(ParsePageSize(&field->memory.page_size));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}